

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LexerFacts.cpp
# Opt level: O1

TokenKind slang::parsing::LexerFacts::getSystemKeywordKind(string_view text)

{
  char *pcVar1;
  uint uVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  TokenKind TVar10;
  int iVar11;
  uint64_t uVar12;
  uint uVar13;
  char *in_RSI;
  ulong uVar14;
  long lVar15;
  size_t in_RDI;
  ulong uVar16;
  basic_string_view<char,_std::char_traits<char>_> *pbVar17;
  bool bVar18;
  undefined1 auVar19 [16];
  basic_string_view<char,_std::char_traits<char>_> local_40;
  
  local_40._M_len = in_RDI;
  local_40._M_str = in_RSI;
  uVar12 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                     ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                      &systemIdentifierKeywords,&local_40);
  lVar9 = DAT_006bfe28;
  lVar8 = DAT_006bfe20;
  uVar7 = DAT_006bfe18;
  uVar14 = uVar12 >> (systemIdentifierKeywords & 0x3f);
  lVar15 = (uVar12 & 0xff) * 4;
  cVar3 = (&UNK_0051605c)[lVar15];
  cVar4 = (&UNK_0051605d)[lVar15];
  cVar5 = (&UNK_0051605e)[lVar15];
  cVar6 = (&UNK_0051605f)[lVar15];
  uVar16 = 0;
  do {
    pcVar1 = (char *)(lVar8 + uVar14 * 0x10);
    auVar19[0] = -(*pcVar1 == cVar3);
    auVar19[1] = -(pcVar1[1] == cVar4);
    auVar19[2] = -(pcVar1[2] == cVar5);
    auVar19[3] = -(pcVar1[3] == cVar6);
    auVar19[4] = -(pcVar1[4] == cVar3);
    auVar19[5] = -(pcVar1[5] == cVar4);
    auVar19[6] = -(pcVar1[6] == cVar5);
    auVar19[7] = -(pcVar1[7] == cVar6);
    auVar19[8] = -(pcVar1[8] == cVar3);
    auVar19[9] = -(pcVar1[9] == cVar4);
    auVar19[10] = -(pcVar1[10] == cVar5);
    auVar19[0xb] = -(pcVar1[0xb] == cVar6);
    auVar19[0xc] = -(pcVar1[0xc] == cVar3);
    auVar19[0xd] = -(pcVar1[0xd] == cVar4);
    auVar19[0xe] = -(pcVar1[0xe] == cVar5);
    auVar19[0xf] = -(pcVar1[0xf] == cVar6);
    uVar13 = (uint)(ushort)((ushort)(SUB161(auVar19 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar19 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar19 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar19 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar19 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar19 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar19 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar19 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar19 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar19 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar19 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar19 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar19 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar19 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar19 >> 0x77,0) & 1) << 0xe);
    if (uVar13 != 0) {
      lVar15 = lVar9 + uVar14 * 0x168;
      do {
        uVar2 = 0;
        if (uVar13 != 0) {
          for (; (uVar13 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
          }
        }
        bVar18 = local_40._M_len == *(size_t *)(lVar15 + (ulong)uVar2 * 0x18);
        pbVar17 = (basic_string_view<char,_std::char_traits<char>_> *)(lVar15 + (ulong)uVar2 * 0x18)
        ;
        if (bVar18 && local_40._M_len != 0) {
          iVar11 = bcmp(local_40._M_str,pbVar17->_M_str,local_40._M_len);
          bVar18 = iVar11 == 0;
        }
        if (bVar18) goto LAB_00152704;
        uVar13 = uVar13 - 1 & uVar13;
      } while (uVar13 != 0);
      pbVar17 = &local_40;
      if (bVar18) goto LAB_00152704;
    }
    if ((*(byte *)(uVar14 * 0x10 + lVar8 + 0xf) &
        (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
          is_not_overflowed(unsigned_long)::shift)[(uint)uVar12 & 7]) == 0) break;
    lVar15 = uVar14 + uVar16;
    uVar16 = uVar16 + 1;
    uVar14 = lVar15 + 1U & uVar7;
  } while (uVar16 <= uVar7);
  pbVar17 = (basic_string_view<char,_std::char_traits<char>_> *)0x0;
LAB_00152704:
  if (pbVar17 == (basic_string_view<char,_std::char_traits<char>_> *)0x0) {
    TVar10 = Unknown;
  }
  else {
    TVar10 = (TokenKind)pbVar17[1]._M_len;
  }
  return TVar10;
}

Assistant:

TokenKind LexerFacts::getSystemKeywordKind(std::string_view text) {
    if (auto it = systemIdentifierKeywords.find(text); it != systemIdentifierKeywords.end())
        return it->second;
    return TokenKind::Unknown;
}